

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_keywords.cpp
# Opt level: O0

unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>,_true>
 duckdb::DuckDBKeywordsInit(ClientContext *context,TableFunctionInitInput *input)

{
  pointer this;
  unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
  in_RDI;
  templated_unique_single_t result;
  vector<duckdb::ParserKeyword,_true> *in_stack_ffffffffffffff98;
  unique_ptr<duckdb::DuckDBKeywordsData,_std::default_delete<duckdb::DuckDBKeywordsData>,_true>
  *in_stack_ffffffffffffffa0;
  
  make_uniq<duckdb::DuckDBKeywordsData>();
  Parser::KeywordList();
  this = unique_ptr<duckdb::DuckDBKeywordsData,_std::default_delete<duckdb::DuckDBKeywordsData>,_true>
         ::operator->(in_stack_ffffffffffffffa0);
  vector<duckdb::ParserKeyword,_true>::operator=
            ((vector<duckdb::ParserKeyword,_true> *)this,in_stack_ffffffffffffff98);
  vector<duckdb::ParserKeyword,_true>::~vector((vector<duckdb::ParserKeyword,_true> *)0x140b744);
  unique_ptr<duckdb::GlobalTableFunctionState,std::default_delete<duckdb::GlobalTableFunctionState>,true>
  ::
  unique_ptr<duckdb::DuckDBKeywordsData,std::default_delete<std::unique_ptr<duckdb::GlobalTableFunctionState,std::default_delete<duckdb::GlobalTableFunctionState>>>,void>
            ((unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>,_true>
              *)this,(unique_ptr<duckdb::DuckDBKeywordsData,_std::default_delete<duckdb::DuckDBKeywordsData>_>
                      *)in_stack_ffffffffffffff98);
  unique_ptr<duckdb::DuckDBKeywordsData,_std::default_delete<duckdb::DuckDBKeywordsData>,_true>::
  ~unique_ptr((unique_ptr<duckdb::DuckDBKeywordsData,_std::default_delete<duckdb::DuckDBKeywordsData>,_true>
               *)0x140b75d);
  return (unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
          )(__uniq_ptr_impl<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
            )in_RDI._M_t.
             super___uniq_ptr_impl<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::GlobalTableFunctionState_*,_std::default_delete<duckdb::GlobalTableFunctionState>_>
             .super__Head_base<0UL,_duckdb::GlobalTableFunctionState_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<GlobalTableFunctionState> DuckDBKeywordsInit(ClientContext &context, TableFunctionInitInput &input) {
	auto result = make_uniq<DuckDBKeywordsData>();
	result->entries = Parser::KeywordList();
	return std::move(result);
}